

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double insphereadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double permanent)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar18;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double b;
  double b_00;
  double b_01;
  double dVar19;
  double dVar20;
  double dVar21;
  double b_02;
  double dVar22;
  double dVar23;
  double dVar24;
  double b_03;
  double dVar25;
  double dVar28;
  double dVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double b_04;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double temp8c [8];
  double temp8b [8];
  double temp8a [8];
  double temp16 [16];
  double temp24 [24];
  double xdet [96];
  double temp48 [48];
  double zdet [96];
  double ydet [96];
  double xydet [192];
  double cdet [288];
  double bdet [288];
  double adet [288];
  double ddet [288];
  double fin1 [1152];
  double cddet [576];
  double abdet [576];
  undefined4 uStack_81e4;
  undefined4 uStack_81e0;
  undefined4 uStack_81dc;
  undefined4 uStack_81d4;
  undefined4 uStack_81d0;
  undefined4 uStack_81cc;
  undefined4 uStack_81c4;
  undefined4 uStack_81c0;
  undefined4 uStack_81bc;
  double local_7f78;
  double dStack_7f70;
  double local_7f68;
  double dStack_7f60;
  double local_7f58;
  double dStack_7f50;
  double local_7f48;
  double local_7f40;
  double local_7f38;
  double dStack_7f30;
  double local_7f28;
  double dStack_7f20;
  double local_7f18 [8];
  double local_7ed8 [8];
  double local_7e98 [8];
  double local_7e58;
  double dStack_7e50;
  double local_7e48;
  double local_7e40;
  double local_7e38;
  double dStack_7e30;
  double local_7e28;
  double dStack_7e20;
  double local_7e18;
  double dStack_7e10;
  double local_7e08;
  double local_7e00;
  double local_7df8 [16];
  double local_7d78 [24];
  double local_7cb8 [96];
  double local_79b8 [48];
  double local_7838 [96];
  double local_7538 [96];
  double local_7238 [192];
  double local_6c38 [288];
  double local_6338 [288];
  double local_5a38 [288];
  double local_5138 [288];
  double local_4838 [1152];
  double local_2438 [576];
  double local_1238 [577];
  
  dVar36 = *pd;
  dVar66 = *pe;
  dVar63 = pe[1];
  dVar39 = *pb;
  dVar41 = pb[1];
  dVar44 = *pa;
  b = dVar36 - dVar66;
  dVar68 = *pc;
  dVar70 = pc[1];
  b_04 = dVar68 - dVar66;
  dVar50 = dVar70 - dVar63;
  b_01 = dVar39 - dVar66;
  b_02 = dVar44 - dVar66;
  dVar46 = pa[1];
  b_03 = dVar41 - dVar63;
  dVar28 = dVar46 - dVar63;
  dVar71 = dVar28 * splitter - (dVar28 * splitter - dVar28);
  dVar73 = b_03 * splitter - (b_03 * splitter - b_03);
  dVar48 = b_04 * splitter - (b_04 * splitter - b_04);
  dVar49 = b_01 * splitter - (b_01 * splitter - b_01);
  dVar42 = pd[1];
  b_00 = dVar42 - dVar63;
  dVar64 = b_00 * splitter - (b_00 * splitter - b_00);
  dVar65 = dVar50 * splitter - (dVar50 * splitter - dVar50);
  dVar14 = splitter * b_02 - (splitter * b_02 - b_02);
  dVar18 = splitter * b - (splitter * b - b);
  dVar25 = b_03 * b_02;
  dVar29 = b * dVar28;
  dVar34 = b_02 - dVar14;
  dVar37 = b - dVar18;
  dVar57 = dVar28 - dVar71;
  dVar59 = b_03 - dVar73;
  dVar19 = dVar59 * dVar34 - (((dVar25 - dVar14 * dVar73) - dVar73 * dVar34) - dVar14 * dVar59);
  dVar22 = dVar57 * dVar37 - (((dVar29 - dVar18 * dVar71) - dVar71 * dVar37) - dVar18 * dVar57);
  dVar30 = b_04 - dVar48;
  dVar32 = b_01 - dVar49;
  dVar20 = -dVar48;
  dVar23 = -dVar49;
  dVar14 = -dVar14;
  dVar18 = -dVar18;
  dVar40 = b_02 * b_00;
  dVar43 = dVar28 * b_01;
  dVar72 = b_00 - dVar64;
  dVar74 = dVar50 - dVar65;
  dVar35 = dVar57 * dVar32 - (dVar23 * dVar57 + dVar71 * -dVar32 + dVar23 * dVar71 + dVar43);
  dVar38 = dVar72 * dVar34 - (dVar14 * dVar72 + dVar64 * -dVar34 + dVar14 * dVar64 + dVar40);
  dVar45 = dVar19 - dVar35;
  dVar47 = dVar22 - dVar38;
  dVar58 = dVar25 + dVar45;
  dVar60 = dVar29 + dVar47;
  dVar25 = (dVar25 - (dVar58 - (dVar58 - dVar25))) + (dVar45 - (dVar58 - dVar25));
  dVar51 = (dVar29 - (dVar60 - (dVar60 - dVar29))) + (dVar47 - (dVar60 - dVar29));
  dVar31 = dVar25 - dVar43;
  dVar33 = dVar51 - dVar40;
  local_7f38 = (dVar19 - (dVar45 + (dVar19 - dVar45))) + ((dVar19 - dVar45) - dVar35);
  dStack_7f30 = (dVar25 - (dVar31 + (dVar25 - dVar31))) + ((dVar25 - dVar31) - dVar43);
  dVar19 = pb[2];
  dVar25 = pa[2];
  dVar29 = pd[2];
  dVar35 = pc[2];
  dVar43 = pe[2];
  dVar21 = dVar58 + dVar31;
  dVar24 = dVar60 + dVar33;
  local_7f28 = (dVar58 - (dVar21 - (dVar21 - dVar58))) + (dVar31 - (dVar21 - dVar58));
  dVar53 = b_00 * b_04;
  dVar54 = b_01 * dVar50;
  dVar58 = dVar30 * dVar72 - (((dVar53 - dVar48 * dVar64) - dVar30 * dVar64) - dVar48 * dVar72);
  dVar52 = dVar32 * dVar74 - (((dVar54 - dVar49 * dVar65) - dVar32 * dVar65) - dVar49 * dVar74);
  dVar48 = b_04 * b_03;
  dVar49 = dVar50 * b;
  dVar67 = dVar37 * dVar74 - (dVar18 * dVar74 + -dVar37 * dVar65 + dVar18 * dVar65 + dVar49);
  dVar69 = dVar30 * dVar59 - (dVar20 * dVar59 + -dVar30 * dVar73 + dVar20 * dVar73 + dVar48);
  dVar61 = dVar58 - dVar67;
  dVar62 = dVar52 - dVar69;
  dVar31 = dVar53 + dVar61;
  dVar45 = dVar54 + dVar62;
  dVar53 = (dVar53 - (dVar31 - (dVar31 - dVar53))) + (dVar61 - (dVar31 - dVar53));
  dVar55 = (dVar54 - (dVar45 - (dVar45 - dVar54))) + (dVar62 - (dVar45 - dVar54));
  dVar54 = dVar53 - dVar49;
  dVar56 = dVar55 - dVar48;
  local_7e18 = (dVar52 - (dVar62 + (dVar52 - dVar62))) + ((dVar52 - dVar62) - dVar69);
  dStack_7e10 = (dVar55 - (dVar56 + (dVar55 - dVar56))) + ((dVar55 - dVar56) - dVar48);
  dVar52 = dVar31 + dVar54;
  dVar55 = dVar45 + dVar56;
  local_7e08 = (dVar45 - (dVar55 - (dVar55 - dVar45))) + (dVar56 - (dVar55 - dVar45));
  local_7e38 = (dVar58 - (dVar61 + (dVar58 - dVar61))) + ((dVar58 - dVar61) - dVar67);
  dStack_7e30 = (dVar53 - (dVar54 + (dVar53 - dVar54))) + ((dVar53 - dVar54) - dVar49);
  local_7e28 = (dVar31 - (dVar52 - (dVar52 - dVar31))) + (dVar54 - (dVar52 - dVar31));
  local_7f58 = (dVar22 - (dVar47 + (dVar22 - dVar47))) + ((dVar22 - dVar47) - dVar38);
  dStack_7f50 = (dVar51 - (dVar33 + (dVar51 - dVar33))) + ((dVar51 - dVar33) - dVar40);
  local_7f48 = (dVar60 - (dVar24 - (dVar24 - dVar60))) + (dVar33 - (dVar24 - dVar60));
  dVar31 = b_02 * dVar50;
  dVar45 = b_00 * b_01;
  dVar38 = dVar32 * dVar72 - (dVar23 * dVar72 + -dVar32 * dVar64 + dVar23 * dVar64 + dVar45);
  dVar34 = dVar34 * dVar74 - (dVar14 * dVar74 + -dVar34 * dVar65 + dVar14 * dVar65 + dVar31);
  dVar23 = b_04 * dVar28;
  dVar48 = b_03 * b;
  dVar32 = dVar30 * dVar57 - (dVar20 * dVar57 + -dVar30 * dVar71 + dVar20 * dVar71 + dVar23);
  dVar33 = dVar37 * dVar59 - (dVar18 * dVar59 + -dVar37 * dVar73 + dVar18 * dVar73 + dVar48);
  dVar49 = dVar34 - dVar32;
  dVar30 = dVar38 - dVar33;
  dVar18 = dVar31 + dVar49;
  dVar20 = dVar45 + dVar30;
  dVar14 = (dVar31 - (dVar18 - (dVar18 - dVar31))) + (dVar49 - (dVar18 - dVar31));
  dVar31 = (dVar45 - (dVar20 - (dVar20 - dVar45))) + (dVar30 - (dVar20 - dVar45));
  dVar45 = dVar14 - dVar23;
  dVar22 = dVar31 - dVar48;
  local_7f78 = (dVar34 - (dVar49 + (dVar34 - dVar49))) + ((dVar34 - dVar49) - dVar32);
  dStack_7f70 = (dVar14 - (dVar45 + (dVar14 - dVar45))) + ((dVar14 - dVar45) - dVar23);
  dVar23 = dVar18 + dVar45;
  dVar49 = dVar20 + dVar22;
  local_7f68 = (dVar18 - (dVar23 - (dVar23 - dVar18))) + (dVar45 - (dVar23 - dVar18));
  local_7e58 = (dVar38 - (dVar30 + (dVar38 - dVar30))) + ((dVar38 - dVar30) - dVar33);
  dStack_7e50 = (dVar31 - (dVar22 + (dVar31 - dVar22))) + ((dVar31 - dVar22) - dVar48);
  local_7e48 = (dVar20 - (dVar49 - (dVar49 - dVar20))) + (dVar22 - (dVar49 - dVar20));
  dVar14 = dVar19 - dVar43;
  dVar45 = dVar25 - dVar43;
  dVar20 = dVar29 - dVar43;
  dVar22 = dVar35 - dVar43;
  dStack_7f60 = dVar23;
  local_7f40 = dVar24;
  dStack_7f20 = dVar21;
  local_7e40 = dVar49;
  dStack_7e20 = dVar52;
  local_7e00 = dVar55;
  iVar6 = scale_expansion_zeroelim(4,&local_7e38,dVar14,local_7e98);
  dVar31 = -dVar22;
  iVar7 = scale_expansion_zeroelim(4,&local_7e58,dVar31,local_7ed8);
  iVar8 = scale_expansion_zeroelim(4,&local_7e18,dVar20,local_7f18);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_7e98,iVar7,local_7ed8,local_7df8);
  iVar6 = fast_expansion_sum_zeroelim(iVar8,local_7f18,iVar6,local_7df8,local_7d78);
  iVar7 = scale_expansion_zeroelim(iVar6,local_7d78,b_02,local_79b8);
  iVar7 = scale_expansion_zeroelim(iVar7,local_79b8,-b_02,local_7cb8);
  uStack_81c4 = (undefined4)((ulong)b_03 >> 0x20);
  uStack_81c0 = SUB84(dVar28,0);
  uStack_81bc = (undefined4)((ulong)dVar28 >> 0x20);
  auVar3._4_8_ = extraout_XMM0_Qb;
  auVar3._0_4_ = uStack_81c4;
  auVar17._0_8_ = auVar3._0_8_ << 0x20;
  auVar17._8_4_ = uStack_81c0;
  auVar17._12_4_ = uStack_81bc;
  iVar8 = scale_expansion_zeroelim(iVar6,local_7d78,auVar17._8_8_,local_79b8);
  iVar8 = scale_expansion_zeroelim(iVar8,local_79b8,-auVar17._8_8_,local_7538);
  uStack_81e4 = (undefined4)((ulong)dVar14 >> 0x20);
  uStack_81e0 = SUB84(dVar45,0);
  uStack_81dc = (undefined4)((ulong)dVar45 >> 0x20);
  auVar4._4_8_ = extraout_XMM0_Qb_00;
  auVar4._0_4_ = uStack_81e4;
  auVar27._0_8_ = auVar4._0_8_ << 0x20;
  auVar27._8_4_ = uStack_81e0;
  auVar27._12_4_ = uStack_81dc;
  dVar18 = auVar27._8_8_;
  iVar6 = scale_expansion_zeroelim(iVar6,local_7d78,dVar18,local_79b8);
  iVar6 = scale_expansion_zeroelim(iVar6,local_79b8,-dVar18,local_7838);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_7cb8,iVar8,local_7538,local_7238);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_7238,iVar6,local_7838,local_5a38);
  iVar7 = scale_expansion_zeroelim(4,&local_7f58,dVar22,local_7e98);
  iVar8 = scale_expansion_zeroelim(4,&local_7f78,dVar20,local_7ed8);
  iVar9 = scale_expansion_zeroelim(4,&local_7e38,dVar18,local_7f18);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_7e98,iVar8,local_7ed8,local_7df8);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,local_7f18,iVar7,local_7df8,local_7d78);
  iVar8 = scale_expansion_zeroelim(iVar7,local_7d78,b_01,local_79b8);
  iVar8 = scale_expansion_zeroelim(iVar8,local_79b8,b_01,local_7cb8);
  iVar9 = scale_expansion_zeroelim(iVar7,local_7d78,b_03,local_79b8);
  iVar9 = scale_expansion_zeroelim(iVar9,local_79b8,b_03,local_7538);
  iVar7 = scale_expansion_zeroelim(iVar7,local_7d78,dVar14,local_79b8);
  iVar7 = scale_expansion_zeroelim(iVar7,local_79b8,dVar14,local_7838);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_7cb8,iVar9,local_7538,local_7238);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,local_7238,iVar7,local_7838,local_6338);
  iVar8 = scale_expansion_zeroelim(4,&local_7f38,dVar20,local_7e98);
  iVar9 = scale_expansion_zeroelim(4,&local_7e58,dVar18,local_7ed8);
  iVar10 = scale_expansion_zeroelim(4,&local_7f58,dVar14,local_7f18);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_7e98,iVar9,local_7ed8,local_7df8);
  iVar8 = fast_expansion_sum_zeroelim(iVar10,local_7f18,iVar8,local_7df8,local_7d78);
  iVar9 = scale_expansion_zeroelim(iVar8,local_7d78,b_04,local_79b8);
  uStack_81d4 = (undefined4)((ulong)b_04 >> 0x20);
  iVar9 = scale_expansion_zeroelim(iVar9,local_79b8,-b_04,local_7cb8);
  uStack_81d0 = SUB84(dVar50,0);
  uStack_81cc = (undefined4)((ulong)dVar50 >> 0x20);
  auVar5._4_8_ = extraout_XMM0_Qb_01;
  auVar5._0_4_ = uStack_81d4;
  auVar15._0_8_ = auVar5._0_8_ << 0x20;
  auVar15._8_4_ = uStack_81d0;
  auVar15._12_4_ = uStack_81cc;
  iVar10 = scale_expansion_zeroelim(iVar8,local_7d78,auVar15._8_8_,local_79b8);
  iVar10 = scale_expansion_zeroelim(iVar10,local_79b8,-dVar50,local_7538);
  iVar8 = scale_expansion_zeroelim(iVar8,local_7d78,dVar22,local_79b8);
  iVar8 = scale_expansion_zeroelim(iVar8,local_79b8,dVar31,local_7838);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,local_7cb8,iVar10,local_7538,local_7238);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,local_7238,iVar8,local_7838,local_6c38);
  iVar9 = scale_expansion_zeroelim(4,&local_7e18,dVar18,local_7e98);
  dVar18 = -dVar14;
  iVar10 = scale_expansion_zeroelim(4,&local_7f78,dVar18,local_7ed8);
  iVar11 = scale_expansion_zeroelim(4,&local_7f38,dVar22,local_7f18);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,local_7e98,iVar10,local_7ed8,local_7df8);
  iVar9 = fast_expansion_sum_zeroelim(iVar11,local_7f18,iVar9,local_7df8,local_7d78);
  iVar10 = scale_expansion_zeroelim(iVar9,local_7d78,b,local_79b8);
  iVar10 = scale_expansion_zeroelim(iVar10,local_79b8,b,local_7cb8);
  iVar11 = scale_expansion_zeroelim(iVar9,local_7d78,b_00,local_79b8);
  iVar11 = scale_expansion_zeroelim(iVar11,local_79b8,b_00,local_7538);
  iVar9 = scale_expansion_zeroelim(iVar9,local_7d78,dVar20,local_79b8);
  iVar9 = scale_expansion_zeroelim(iVar9,local_79b8,dVar20,local_7838);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,local_7cb8,iVar11,local_7538,local_7238);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,local_7238,iVar9,local_7838,local_5138);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_5a38,iVar7,local_6338,local_1238);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,local_6c38,iVar9,local_5138,local_2438);
  uVar12 = fast_expansion_sum_zeroelim(iVar6,local_1238,iVar7,local_2438,local_4838);
  if (1 < (int)uVar12) {
    uVar13 = 1;
    do {
      local_4838[0] = local_4838[0] + local_4838[uVar13];
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
  }
  if ((local_4838[0] < isperrboundB * permanent) && (-local_4838[0] < isperrboundB * permanent)) {
    dVar48 = (dVar39 - (b_01 + (dVar39 - b_01))) + ((dVar39 - b_01) - dVar66);
    dVar30 = (dVar44 - (b_02 + (dVar44 - b_02))) + ((dVar44 - b_02) - dVar66);
    dVar32 = (dVar41 - (b_03 + (dVar41 - b_03))) + ((dVar41 - b_03) - dVar63);
    dVar33 = (dVar46 - (dVar28 + (dVar46 - dVar28))) + ((dVar46 - dVar28) - dVar63);
    dVar46 = (dVar19 - (dVar14 + (dVar19 - dVar14))) + ((dVar19 - dVar14) - dVar43);
    dVar19 = (dVar25 - (dVar45 + (dVar25 - dVar45))) + ((dVar25 - dVar45) - dVar43);
    dVar25 = (dVar36 - (b + (dVar36 - b))) + ((dVar36 - b) - dVar66);
    dVar66 = (dVar68 - (b_04 + (dVar68 - b_04))) + ((dVar68 - b_04) - dVar66);
    dVar36 = (dVar42 - (b_00 + (dVar42 - b_00))) + ((dVar42 - b_00) - dVar63);
    dVar39 = (dVar70 - (dVar50 + (dVar70 - dVar50))) + ((dVar70 - dVar50) - dVar63);
    dVar41 = (dVar29 - (dVar20 + (dVar29 - dVar20))) + ((dVar29 - dVar20) - dVar43);
    dVar44 = (dVar35 - (dVar22 + (dVar35 - dVar22))) + ((dVar35 - dVar22) - dVar43);
    auVar16._8_8_ = -(ulong)(dVar33 != 0.0);
    auVar16._0_8_ = -(ulong)(dVar30 != 0.0);
    auVar1._8_8_ = -(ulong)(dVar48 != 0.0);
    auVar1._0_8_ = -(ulong)(dVar19 != 0.0);
    auVar17 = packssdw(auVar16,auVar1);
    auVar26._8_8_ = -(ulong)(dVar46 != 0.0);
    auVar26._0_8_ = -(ulong)(dVar32 != 0.0);
    auVar2._8_8_ = -(ulong)(dVar39 != 0.0);
    auVar2._0_8_ = -(ulong)(dVar66 != 0.0);
    auVar27 = packssdw(auVar26,auVar2);
    auVar17 = packssdw(auVar17,auVar27);
    if (((((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                        (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar17[0xf] < '\0') ||
         ((((dVar44 != 0.0 || (NAN(dVar44))) || (dVar25 != 0.0)) ||
          ((NAN(dVar25) || (dVar36 != 0.0)))))) || (NAN(dVar36))) ||
       ((dVar41 != 0.0 || (NAN(dVar41))))) {
      dVar35 = permanent * isperrboundC + ABS(local_4838[0]) * resulterrbound;
      dVar68 = (b_04 * dVar36 + dVar66 * b_00) - (dVar50 * dVar25 + dVar39 * b);
      dVar70 = (b_01 * dVar39 + dVar48 * dVar50) - (b_03 * dVar66 + dVar32 * b_04);
      dVar43 = (b_02 * dVar32 + dVar30 * b_03) - (dVar28 * dVar48 + dVar33 * b_01);
      dVar63 = (b * dVar33 + dVar25 * dVar28) - (b_00 * dVar30 + dVar36 * b_02);
      dVar42 = (b_01 * dVar36 + dVar48 * b_00) - (b_03 * dVar25 + b * dVar32);
      dVar29 = (b_02 * dVar39 + dVar30 * dVar50) - (dVar28 * dVar66 + b_04 * dVar33);
      dVar36 = ((dVar22 * dVar21 + dVar55 * dVar45 + dVar18 * dVar23) *
                (dVar20 * dVar41 + b * dVar25 + b_00 * dVar36) +
               (dVar52 * dVar45 + dVar24 * dVar22 + dVar20 * dVar23) *
               (dVar14 * dVar46 + b_01 * dVar48 + b_03 * dVar32)) -
               ((dVar14 * dVar24 + dVar21 * dVar20 + dVar45 * dVar49) *
                (dVar22 * dVar44 + b_04 * dVar66 + dVar50 * dVar39) +
               (dVar55 * dVar20 + dVar52 * dVar14 + dVar31 * dVar49) *
               (dVar45 * dVar19 + b_02 * dVar30 + dVar28 * dVar33));
      local_4838[0] =
           dVar36 + dVar36 +
           (((dVar44 * dVar21 + dVar19 * dVar55 + -dVar46 * dVar23 +
             dVar43 * dVar22 + dVar70 * dVar45 + dVar29 * dVar18) *
             (dVar20 * dVar20 + b * b + b_00 * b_00) +
            (dVar19 * dVar52 + dVar44 * dVar24 + dVar41 * dVar23 +
            dVar45 * dVar68 + dVar63 * dVar22 + dVar20 * dVar29) *
            (dVar14 * dVar14 + b_01 * b_01 + b_03 * b_03)) -
           ((dVar46 * dVar24 + dVar41 * dVar21 + dVar19 * dVar49 +
            dVar63 * dVar14 + dVar43 * dVar20 + dVar42 * dVar45) *
            (dVar22 * dVar22 + b_04 * b_04 + dVar50 * dVar50) +
           (dVar41 * dVar55 + dVar46 * dVar52 + -dVar44 * dVar49 +
           dVar20 * dVar70 + dVar68 * dVar14 + dVar31 * dVar42) *
           (dVar45 * dVar45 + b_02 * b_02 + dVar28 * dVar28))) + local_4838[0];
      if ((local_4838[0] < dVar35) && (-local_4838[0] < dVar35)) {
        dVar36 = insphereexact(pa,pb,pc,pd,pe);
        return dVar36;
      }
    }
  }
  return local_4838[0];
}

Assistant:

REAL insphereadapt(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe,
                   REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24], temp48[48];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len, temp48len;
  REAL xdet[96], ydet[96], zdet[96], xydet[192];
  int xlen, ylen, zlen, xylen;
  REAL adet[288], bdet[288], cdet[288], ddet[288];
  int alen, blen, clen, dlen;
  REAL abdet[576], cddet[576];
  int ablen, cdlen;
  REAL fin1[1152];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -aex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -aey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, aez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -aez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  alen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, bex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, bey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, bez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, bez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  blen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, -cex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, -cey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, cez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, -cez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  clen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dex, temp48);
  xlen = scale_expansion_zeroelim(temp48len, temp48, dex, xdet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dey, temp48);
  ylen = scale_expansion_zeroelim(temp48len, temp48, dey, ydet);
  temp48len = scale_expansion_zeroelim(temp24len, temp24, dez, temp48);
  zlen = scale_expansion_zeroelim(temp48len, temp48, dez, zdet);
  xylen = fast_expansion_sum_zeroelim(xlen, xdet, ylen, ydet, xydet);
  dlen = fast_expansion_sum_zeroelim(xylen, xydet, zlen, zdet, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += (((bex * bex + bey * bey + bez * bez)
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + (dex * dex + dey * dey + dez * dez)
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - ((aex * aex + aey * aey + aez * aez)
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + (cex * cex + cey * cey + cez * cez)
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + 2.0 * (((bex * bextail + bey * beytail + bez * beztail)
                 * (cez * da3 + dez * ac3 + aez * cd3)
                 + (dex * dextail + dey * deytail + dez * deztail)
                 * (aez * bc3 - bez * ac3 + cez * ab3))
                - ((aex * aextail + aey * aeytail + aez * aeztail)
                 * (bez * cd3 - cez * bd3 + dez * bc3)
                 + (cex * cextail + cey * ceytail + cez * ceztail)
                 * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return insphereexact(pa, pb, pc, pd, pe);
}